

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O2

void RelationalExpression_le_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *v;
  JsValue *res_00;
  JsValue *res_01;
  undefined1 local_a8 [8];
  JsValue r1;
  JsValue r2;
  JsValue r3;
  JsValue r4;
  JsValue r5;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_a8);
  res_01 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_a8,res_01);
  v = (JsValue *)((long)&r2.u + 8);
  (*JsNodeClassEval[((JsAstNode *)na[1].location)->astClass])((JsAstNode *)na[1].location,context,v)
  ;
  res_00 = (JsValue *)((long)&r3.u + 8);
  JsGetValue(v,res_00);
  JsRelationalExpressionCompare(res_00,res_01,(JsValue *)((long)&r4.u + 8));
  res->type = JS_BOOLEAN;
  if ((r4.u.completion.type == JS_COMPLETION_NORMAL) || (r5.type == JS_NULL)) {
    (res->u).boolean = 0;
  }
  else {
    (res->u).boolean = 1;
  }
  return;
}

Assistant:

static void
RelationalExpression_le_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstBinaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstBinaryNode *n = CAST_NODE(na, JsAstBinaryNode);
	struct JsValue r1, r2, r3, r4, r5;

	
	
	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	EVAL(n->b, context, &r3);
	JsGetValue( &r3, &r4);
	JsRelationalExpressionCompare( &r4, &r2, &r5);
	if (r5.type == JS_UNDEFINED){
		res->type = JS_BOOLEAN;
		res->u.boolean = FALSE;
	}
	else{
		res->type = JS_BOOLEAN;
		if(r5.u.boolean == TRUE){
			res->u.boolean = FALSE;
		}else{
			res->u.boolean = TRUE;
		}
	}
}